

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.cpp
# Opt level: O3

void __thiscall
zmq::xsub_t::xattach_pipe(xsub_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  if (pipe_ == (pipe_t *)0x0) {
    xattach_pipe();
  }
  fq_t::attach(&this->_fq,pipe_);
  dist_t::attach(&this->_dist,pipe_);
  radix_tree_t::apply(&this->_subscriptions,send_subscription,pipe_);
  pipe_t::flush(pipe_);
  return;
}

Assistant:

void zmq::xsub_t::xattach_pipe (pipe_t *pipe_,
                                bool subscribe_to_all_,
                                bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);
    LIBZMQ_UNUSED (locally_initiated_);

    zmq_assert (pipe_);
    _fq.attach (pipe_);
    _dist.attach (pipe_);

    //  Send all the cached subscriptions to the new upstream peer.
    _subscriptions.apply (send_subscription, pipe_);
    pipe_->flush ();
}